

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O1

string * __thiscall Entity::toString_abi_cxx11_(Entity *this)

{
  string *psVar1;
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"Not implemented","");
  return psVar1;
}

Assistant:

string* Entity::toString() {
    return new string("Not implemented");
}